

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O3

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,NormalFuncCall *n_func_call,void *data)

{
  SyntaxTree *pSVar1;
  ExpVarData exp_var_data;
  undefined8 local_2c;
  undefined1 local_24;
  
  local_2c = 1;
  local_24 = 0;
  pSVar1 = (n_func_call->caller_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,&local_2c);
  pSVar1 = (n_func_call->args_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,&local_2c);
  if (data != (void *)0x0) {
    *(undefined1 *)((long)data + 8) = 1;
  }
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(NormalFuncCall *n_func_call, void *data)
    {
        // Function call must be read semantic
        ExpVarData exp_var_data{ SemanticOp_Read };
        n_func_call->caller_->Accept(this, &exp_var_data);
        n_func_call->args_->Accept(this, &exp_var_data);

        if (data)
            static_cast<ExpVarData *>(data)->results_any_count_ = true;
    }